

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O2

void __thiscall
trompeloeil::list_elem<trompeloeil::call_matcher_base<void_()>_>::~list_elem
          (list_elem<trompeloeil::call_matcher_base<void_()>_> *this)

{
  char *in_RSI;
  
  this->_vptr_list_elem = (_func_int **)&PTR__list_elem_00181e58;
  unlink(this,in_RSI);
  return;
}

Assistant:

virtual
    ~list_elem()
    {
      unlink();
    }